

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.h
# Opt level: O0

void __thiscall MutableS2ShapeIndex::Iterator::Refresh(Iterator *this)

{
  S2CellId id;
  bool bVar1;
  pointer ppVar2;
  Iterator *this_local;
  
  bVar1 = gtl::internal_btree::
          btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
          ::operator==(&this->iter_,&this->end_);
  if (bVar1) {
    S2ShapeIndex::IteratorBase::set_finished(&this->super_IteratorBase);
  }
  else {
    ppVar2 = gtl::internal_btree::
             btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
             ::operator->(&this->iter_);
    id.id_ = (ppVar2->first).id_;
    ppVar2 = gtl::internal_btree::
             btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
             ::operator->(&this->iter_);
    S2ShapeIndex::IteratorBase::set_state(&this->super_IteratorBase,id,ppVar2->second);
  }
  return;
}

Assistant:

inline void MutableS2ShapeIndex::Iterator::Refresh() {
  if (iter_ == end_) {
    set_finished();
  } else {
    set_state(iter_->first, iter_->second);
  }
}